

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdSetRawReissueAsset
              (void *handle,char *tx_hex_string,char *txid,uint32_t vout,int64_t asset_amount,
              char *blinding_nonce,char *entropy,char *address,char *direct_locking_script,
              char **asset_string,char **tx_string)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  CfdException *pCVar4;
  Amount AVar5;
  initializer_list<cfd::api::TxInReissuanceParameters> __l;
  allocator local_50a;
  ElementsTransactionApi api;
  ConfidentialAssetId local_508;
  char *work_asset_string;
  vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> outputs;
  Amount local_498;
  vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
  issuances;
  TxInReissuanceParameters params;
  ConfidentialTransactionController ctxc;
  ElementsAddressFactory address_factory;
  ConfidentialTxOut asset_txout;
  
  work_asset_string = (char *)0x0;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    params.txid._vptr_Txid = (_func_int **)0x4fbb12;
    params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x3c1;
    params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdSetRawReissueAsset";
    cfd::core::logger::warn<>((CfdSourceLocation *)&params,"tx is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&params,"Failed to parameter. tx is null or empty.",(allocator *)&ctxc);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&params);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tx_string == (char **)0x0) {
    params.txid._vptr_Txid = (_func_int **)0x4fbb12;
    params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x3c7;
    params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdSetRawReissueAsset";
    cfd::core::logger::warn<>((CfdSourceLocation *)&params,"tx is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&params,"Failed to parameter. output tx is null.",(allocator *)&ctxc);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&params);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    params.txid._vptr_Txid = (_func_int **)0x4fbb12;
    params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x3cd;
    params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdSetRawReissueAsset";
    cfd::core::logger::warn<>((CfdSourceLocation *)&params,"txid is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&params,"Failed to parameter. txid is null or empty.",(allocator *)&ctxc);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&params);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(blinding_nonce);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(entropy);
    if (!bVar1) {
      cfd::core::ConfidentialTxOut::ConfidentialTxOut(&asset_txout);
      AVar5 = cfd::core::Amount::CreateBySatoshiAmount(asset_amount);
      local_498.amount_ = AVar5.amount_;
      local_498.ignore_check_ = AVar5.ignore_check_;
      cfd::ElementsAddressFactory::ElementsAddressFactory(&address_factory);
      bVar1 = cfd::capi::IsEmptyString(address);
      if (bVar1) {
        bVar1 = cfd::capi::IsEmptyString(direct_locking_script);
        if (!bVar1) {
          std::__cxx11::string::string
                    ((string *)&params,direct_locking_script,(allocator *)&local_508);
          cfd::core::Script::Script((Script *)&ctxc,(string *)&params);
          std::__cxx11::string::~string((string *)&params);
          cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_508);
          cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&outputs,&local_498);
          cfd::core::ConfidentialTxOut::ConfidentialTxOut
                    ((ConfidentialTxOut *)&params,(Script *)&ctxc,&local_508,
                     (ConfidentialValue *)&outputs);
          cfd::core::ConfidentialTxOut::operator=(&asset_txout,(ConfidentialTxOut *)&params);
          cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)&params);
          cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&outputs);
          cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_508);
          cfd::core::Script::~Script((Script *)&ctxc);
        }
      }
      else {
        std::__cxx11::string::string((string *)&outputs,address,(allocator *)&params);
        bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress((string *)&outputs);
        if (bVar1) {
          cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                    ((ElementsConfidentialAddress *)&params,(string *)&outputs);
          cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_508);
          cfd::core::ConfidentialTxOut::ConfidentialTxOut
                    ((ConfidentialTxOut *)&ctxc,(ElementsConfidentialAddress *)&params,&local_508,
                     &local_498);
          cfd::core::ConfidentialTxOut::operator=(&asset_txout,(ConfidentialTxOut *)&ctxc);
          cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)&ctxc);
          cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_508);
          cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                    ((ElementsConfidentialAddress *)&params);
        }
        else {
          cfd::AddressFactory::GetAddress
                    ((Address *)&params,&address_factory.super_AddressFactory,(string *)&outputs);
          cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_508);
          cfd::core::ConfidentialTxOut::ConfidentialTxOut
                    ((ConfidentialTxOut *)&ctxc,(Address *)&params,&local_508,&local_498);
          cfd::core::ConfidentialTxOut::operator=(&asset_txout,(ConfidentialTxOut *)&ctxc);
          cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)&ctxc);
          cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_508);
          cfd::core::Address::~Address((Address *)&params);
        }
        std::__cxx11::string::~string((string *)&outputs);
      }
      cfd::api::TxInReissuanceParameters::TxInReissuanceParameters(&params);
      std::__cxx11::string::string((string *)&local_508,txid,(allocator *)&outputs);
      cfd::core::Txid::Txid((Txid *)&ctxc,(string *)&local_508);
      cfd::core::Txid::operator=(&params.txid,(Txid *)&ctxc);
      cfd::core::Txid::~Txid((Txid *)&ctxc);
      std::__cxx11::string::~string((string *)&local_508);
      params.amount.amount_ = local_498.amount_;
      params.amount.ignore_check_ = local_498.ignore_check_;
      params.vout = vout;
      cfd::core::ConfidentialTxOut::operator=(&params.asset_txout,&asset_txout);
      std::__cxx11::string::string((string *)&local_508,blinding_nonce,(allocator *)&outputs);
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)&ctxc,(string *)&local_508);
      cfd::core::BlindFactor::operator=(&params.blind_factor,(BlindFactor *)&ctxc);
      cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&ctxc);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::string((string *)&local_508,entropy,(allocator *)&outputs);
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)&ctxc,(string *)&local_508);
      cfd::core::BlindFactor::operator=(&params.entropy,(BlindFactor *)&ctxc);
      cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&ctxc);
      std::__cxx11::string::~string((string *)&local_508);
      outputs.
      super__Vector_base<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      outputs.
      super__Vector_base<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      outputs.
      super__Vector_base<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cfd::api::TxInReissuanceParameters::TxInReissuanceParameters
                ((TxInReissuanceParameters *)&ctxc,&params);
      __l._M_len = 1;
      __l._M_array = (iterator)&ctxc;
      std::
      vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
      ::vector(&issuances,__l,(allocator_type *)&local_508);
      cfd::api::TxInReissuanceParameters::~TxInReissuanceParameters
                ((TxInReissuanceParameters *)&ctxc);
      std::__cxx11::string::string((string *)&local_508,tx_hex_string,&local_50a);
      cfd::api::ElementsTransactionApi::SetRawReissueAsset
                (&ctxc,&api,(string *)&local_508,&issuances,&outputs);
      std::__cxx11::string::~string((string *)&local_508);
      pcVar2 = (char *)0x0;
      if ((asset_string != (char **)0x0) &&
         (outputs.
          super__Vector_base<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          outputs.
          super__Vector_base<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                  ((string *)&local_508,
                   &((outputs.
                      super__Vector_base<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>
                      ._M_impl.super__Vector_impl_data._M_start)->output).asset);
        pcVar2 = cfd::capi::CreateString((string *)&local_508);
        work_asset_string = pcVar2;
        std::__cxx11::string::~string((string *)&local_508);
      }
      cfd::AbstractTransactionController::GetHex_abi_cxx11_
                ((string *)&local_508,&ctxc.super_AbstractTransactionController);
      pcVar3 = cfd::capi::CreateString((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_508);
      if (pcVar2 != (char *)0x0) {
        *asset_string = pcVar2;
      }
      *tx_string = pcVar3;
      cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&ctxc);
      std::
      vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
      ::~vector(&issuances);
      std::vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>::~vector
                (&outputs);
      cfd::api::TxInReissuanceParameters::~TxInReissuanceParameters(&params);
      cfd::AddressFactory::~AddressFactory(&address_factory.super_AddressFactory);
      cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&asset_txout);
      return 0;
    }
    params.txid._vptr_Txid = (_func_int **)0x4fbb12;
    params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x3d9;
    params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdSetRawReissueAsset";
    cfd::core::logger::warn<>((CfdSourceLocation *)&params,"entropy is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&params,"Failed to parameter. entropy is null or empty.",(allocator *)&ctxc
              );
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&params);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  params.txid._vptr_Txid = (_func_int **)0x4fbb12;
  params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x3d3;
  params.txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "CfdSetRawReissueAsset";
  cfd::core::logger::warn<>((CfdSourceLocation *)&params,"blinding nonce is null or empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&params,"Failed to parameter. blinding nonce is null or empty.",
             (allocator *)&ctxc);
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&params);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSetRawReissueAsset(
    void* handle, const char* tx_hex_string, const char* txid, uint32_t vout,
    int64_t asset_amount, const char* blinding_nonce, const char* entropy,
    const char* address, const char* direct_locking_script,
    char** asset_string, char** tx_string) {
  char* work_asset_string = nullptr;
  char* work_tx_string = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output tx is null.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(blinding_nonce)) {
      warn(CFD_LOG_SOURCE, "blinding nonce is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. blinding nonce is null or empty.");
    }
    if (IsEmptyString(entropy)) {
      warn(CFD_LOG_SOURCE, "entropy is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. entropy is null or empty.");
    }

    ConfidentialTxOut asset_txout;
    Amount amount = Amount::CreateBySatoshiAmount(asset_amount);
    ElementsAddressFactory address_factory;
    if (!IsEmptyString(address)) {
      std::string addr(address);
      if (ElementsConfidentialAddress::IsConfidentialAddress(addr)) {
        ElementsConfidentialAddress confidential_addr(addr);
        asset_txout = ConfidentialTxOut(
            confidential_addr, ConfidentialAssetId(), amount);
      } else {
        Address unblind_addr = address_factory.GetAddress(addr);
        asset_txout =
            ConfidentialTxOut(unblind_addr, ConfidentialAssetId(), amount);
      }
    } else if (!IsEmptyString(direct_locking_script)) {
      Script script(direct_locking_script);
      asset_txout = ConfidentialTxOut(
          script, ConfidentialAssetId(), ConfidentialValue(amount));
    }

    TxInReissuanceParameters params;
    params.txid = Txid(std::string(txid));
    params.vout = vout;
    params.amount = amount;
    params.asset_txout = asset_txout;
    params.blind_factor = BlindFactor(std::string(blinding_nonce));
    params.entropy = BlindFactor(std::string(entropy));

    ElementsTransactionApi api;
    std::vector<IssuanceOutput> outputs;
    std::vector<TxInReissuanceParameters> issuances{params};
    ConfidentialTransactionController ctxc =
        api.SetRawReissueAsset(tx_hex_string, issuances, &outputs);

    if (!outputs.empty() && (asset_string != nullptr)) {
      work_asset_string = CreateString(outputs[0].output.asset.GetHex());
    }
    work_tx_string = CreateString(ctxc.GetHex());

    if (work_asset_string != nullptr) *asset_string = work_asset_string;
    *tx_string = work_tx_string;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_asset_string, &work_tx_string);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_asset_string, &work_tx_string);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_asset_string, &work_tx_string);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}